

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O1

SUNErrCode SUNAdaptController_SetParams_I(SUNAdaptController C,sunrealtype k1)

{
  sunrealtype *psVar1;
  
  psVar1 = (sunrealtype *)C->content;
  *psVar1 = k1;
  psVar1[1] = 0.0;
  psVar1[2] = 0.0;
  psVar1[3] = 0.0;
  psVar1[4] = 0.0;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetParams_I(SUNAdaptController C, sunrealtype k1)
{
  SUNFunctionBegin(C->sunctx);
  SODERLIND_K1(C) = k1;
  SODERLIND_K2(C) = SUN_RCONST(0.0);
  SODERLIND_K3(C) = SUN_RCONST(0.0);
  SODERLIND_K4(C) = SUN_RCONST(0.0);
  SODERLIND_K5(C) = SUN_RCONST(0.0);
  return SUN_SUCCESS;
}